

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void nlohmann::detail::
     serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     ::throw_if_invalid_utf8(string *str)

{
  uint *puVar1;
  byte bVar2;
  ostream *poVar3;
  type_error *ptVar4;
  byte bVar5;
  unsigned_long __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream ss;
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [88];
  
  bVar5 = 0;
  __val = 0;
  while( true ) {
    if (str->_M_string_length == __val) {
      if (bVar5 == 0) {
        return;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
      puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      poVar3 = std::operator<<(local_198,0x30);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<
                ((ostream *)poVar3,(uint)(byte)(str->_M_dataplus)._M_p[str->_M_string_length - 1]);
      ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_228,"incomplete UTF-8 string; last byte: 0x",&bStack_248);
      type_error::create(ptVar4,0x13c,&local_228);
      __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
    }
    bVar2 = (str->_M_dataplus)._M_p[__val];
    bVar5 = serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            ::decode(unsigned_char&,unsigned_char)::utf8d
            [(ulong)bVar5 * 0x10 +
             (ulong)(byte)serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                          ::decode(unsigned_char&,unsigned_char)::utf8d[bVar2] + 0x100];
    if (bVar5 == 1) break;
    __val = __val + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  poVar3 = std::operator<<(local_198,0x30);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::operator<<((ostream *)poVar3,(uint)bVar2);
  ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::to_string(&local_1e8,__val);
  std::operator+(&local_1c8,"invalid UTF-8 byte at index ",&local_1e8);
  std::operator+(&bStack_248,&local_1c8,": 0x");
  std::__cxx11::stringbuf::str();
  std::operator+(&local_228,&bStack_248,&local_208);
  type_error::create(ptVar4,0x13c,&local_228);
  __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
}

Assistant:

static void throw_if_invalid_utf8(const std::string& str)
    {
        // start with state 0 (= accept)
        uint8_t state = 0;

        for (size_t i = 0; i < str.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(str[i]);
            decode(state, byte);
            if (state == 1)
            {
                // state 1 means reject
                std::stringstream ss;
                ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
                JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
            }
        }

        if (state != 0)
        {
            // we finish reading, but do not accept: string was incomplete
            std::stringstream ss;
            ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(str.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
        }
    }